

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

int __thiscall
QSequentialAnimationGroupPrivate::animationActualTotalDuration
          (QSequentialAnimationGroupPrivate *this,int index)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)index;
  iVar1 = QAbstractAnimation::totalDuration
                    ((QAbstractAnimation *)
                     (this->super_QAnimationGroupPrivate).animations.d.ptr[lVar2]);
  if ((iVar1 == -1) && (iVar1 = -1, lVar2 < (this->actualDuration).d.size)) {
    iVar1 = (this->actualDuration).d.ptr[lVar2];
  }
  return iVar1;
}

Assistant:

int QSequentialAnimationGroupPrivate::animationActualTotalDuration(int index) const
{
    QAbstractAnimation *anim = animations.at(index);
    int ret = anim->totalDuration();
    if (ret == -1 && actualDuration.size() > index)
        ret = actualDuration.at(index); //we can try the actual duration there
    return ret;
}